

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void extract_reference_file(char *name)

{
  FILE *__stream;
  char *pcVar1;
  FILE *__stream_00;
  uint uVar2;
  void *in_R8;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  char buff [1024];
  undefined4 local_438;
  short local_434 [514];
  
  sprintf((char *)&local_438,"%s/%s.uu",refdir,name);
  __stream = fopen((char *)&local_438,"r");
  failure("Couldn\'t open reference file %s",&local_438);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/main.c"
                   ,L'࡮',(uint)(__stream != (FILE *)0x0),"in != NULL",in_R8);
  if (__stream == (FILE *)0x0) {
    return;
  }
  do {
    pcVar1 = fgets((char *)&local_438,0x400,__stream);
    if (pcVar1 == (char *)0x0) {
      return;
    }
  } while (local_434[0] != 0x206e || local_438 != 0x69676562);
  __stream_00 = fopen(name,"wb");
  do {
    do {
      pcVar1 = fgets((char *)&local_438,0x400,__stream);
      if ((pcVar1 == (char *)0x0) || (local_438._2_1_ == 'd' && (short)local_438 == 0x6e65)) {
        fclose(__stream_00);
        fclose(__stream);
        return;
      }
    } while ((local_438 & 0x3f) == 0x20);
    uVar4 = local_438 & 0x3f ^ 0x20;
    pbVar3 = (byte *)((long)&local_438 + 1);
    do {
      uVar2 = (pbVar3[1] & 0x3f ^ 0x20) << 0xc;
      fputc(((*pbVar3 & 0x3f ^ 0x20) << 0x12 | uVar2) >> 0x10,__stream_00);
      if (uVar4 == 1) break;
      uVar5 = (pbVar3[2] & 0x3f ^ 0x20) << 6;
      fputc((uVar2 | uVar5) >> 8 & 0xff,__stream_00);
      if (uVar4 == 2) break;
      fputc((uVar5 & 0xff | pbVar3[3] & 0x3f) ^ 0x20,__stream_00);
      pbVar3 = pbVar3 + 4;
      uVar4 = uVar4 - 3;
    } while (uVar4 != 0);
  } while( true );
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	sprintf(buff, "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	/* Not a lot of error checking here; the input better be right. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			if (bytes > 0) {
				n = UUDECODE(*p++) << 18;
				n |= UUDECODE(*p++) << 12;
				fputc(n >> 16, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}